

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O1

void __thiscall
webrtc::DivergentFilterFraction::AddObservation
          (DivergentFilterFraction *this,PowerLevel *nearlevel,PowerLevel *linoutlevel,
          PowerLevel *nlpoutlevel)

{
  size_t sVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = BlockMeanCalculator::GetLatestMean(&nearlevel->framelevel);
  fVar3 = BlockMeanCalculator::GetLatestMean(&linoutlevel->framelevel);
  fVar4 = BlockMeanCalculator::GetLatestMean(&nlpoutlevel->framelevel);
  if (nlpoutlevel->minlevel * 40.0 < fVar4) {
    fVar4 = 1.0;
    if (1.0 <= fVar2 * 0.01) {
      fVar4 = fVar2 * 0.01;
    }
    if (fVar4 < fVar3 - fVar2) {
      this->occurrence_ = this->occurrence_ + 1;
    }
  }
  sVar1 = this->count_ + 1;
  this->count_ = sVar1;
  if (sVar1 == 0x19) {
    this->fraction_ = (float)this->occurrence_ / 25.0;
    this->count_ = 0;
    this->occurrence_ = 0;
  }
  return;
}

Assistant:

void DivergentFilterFraction::AddObservation(const PowerLevel& nearlevel,
                                             const PowerLevel& linoutlevel,
                                             const PowerLevel& nlpoutlevel) {
  const float near_level = nearlevel.framelevel.GetLatestMean();
  const float level_increase =
      linoutlevel.framelevel.GetLatestMean() - near_level;
  const bool output_signal_active = nlpoutlevel.framelevel.GetLatestMean() >
          40.0 * nlpoutlevel.minlevel;
  // Level increase should be, in principle, negative, when the filter
  // does not diverge. Here we allow some margin (0.01 * near end level) and
  // numerical error (1.0). We count divergence only when the AEC output
  // signal is active.
  if (output_signal_active &&
      level_increase > std::max(0.01 * near_level, 1.0))
    occurrence_++;
  ++count_;
  if (count_ == kDivergentFilterFractionAggregationWindowSize) {
    fraction_ = static_cast<float>(occurrence_) /
        kDivergentFilterFractionAggregationWindowSize;
    Clear();
  }
}